

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::BackUp(CopyingInputStreamAdaptor *this,int count)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  LogMessage local_40 [16];
  LogMessageFatal local_30 [16];
  
  bVar2 = this->backup_bytes_ != 0;
  bVar3 = (this->buffer_)._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0;
  if (bVar3 || bVar2) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xe5,0x2b,"backup_bytes_ == 0 && buffer_.get() != NULL");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_30,0x2a," BackUp() can only be called after Next().");
    if (bVar3 || bVar2) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
    }
  }
  if (this->buffer_used_ < count) {
    psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)count,(long)this->buffer_used_,"count <= buffer_used_");
  }
  else {
    psVar1 = (string *)0x0;
  }
  if (psVar1 == (string *)0x0) {
    if (count < 0) {
      psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)count,0,"count >= 0");
    }
    else {
      psVar1 = (string *)0x0;
    }
    if (psVar1 == (string *)0x0) {
      this->backup_bytes_ = count;
      return;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xea,*(undefined8 *)(psVar1 + 8),*(undefined8 *)psVar1);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (local_40,(char (*) [42])" Parameter to BackUp() can\'t be negative.");
  }
  else {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xe7,*(undefined8 *)(psVar1 + 8),*(undefined8 *)psVar1);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (local_40,(char (*) [78])
                        " Can\'t back up over more bytes than were returned by the last call to Next()."
              );
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_40);
}

Assistant:

void CopyingInputStreamAdaptor::BackUp(int count) {
  ABSL_CHECK(backup_bytes_ == 0 && buffer_.get() != NULL)
      << " BackUp() can only be called after Next().";
  ABSL_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";
  ABSL_CHECK_GE(count, 0) << " Parameter to BackUp() can't be negative.";

  backup_bytes_ = count;
}